

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Int_t * Abc_NtkNodeSupportInt(Abc_Ntk_t *pNtk,int iCo)

{
  ulong uVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  int *piVar5;
  Vec_Int_t *vNodes;
  Vec_Ptr_t *pVVar6;
  int iVar7;
  
  if ((iCo < 0) || (pNtk->vCos->nSize <= iCo)) {
    vNodes = (Vec_Int_t *)0x0;
  }
  else {
    pVVar6 = pNtk->vCis;
    if (0 < pVVar6->nSize) {
      lVar4 = 0;
      do {
        *(int *)((long)pVVar6->pArray[lVar4] + 0x40) = (int)lVar4;
        lVar4 = lVar4 + 1;
        pVVar6 = pNtk->vCis;
      } while (lVar4 < pVVar6->nSize);
    }
    if ((pNtk->vTravIds).pArray == (int *)0x0) {
      iVar2 = pNtk->vObjs->nSize;
      uVar1 = (long)iVar2 + 500;
      iVar7 = (int)uVar1;
      if ((pNtk->vTravIds).nCap < iVar7) {
        piVar5 = (int *)malloc(uVar1 * 4);
        (pNtk->vTravIds).pArray = piVar5;
        if (piVar5 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        (pNtk->vTravIds).nCap = iVar7;
      }
      if (-500 < iVar2) {
        memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
      }
      (pNtk->vTravIds).nSize = iVar7;
    }
    iVar2 = pNtk->nTravIds;
    pNtk->nTravIds = iVar2 + 1;
    if (0x3ffffffe < iVar2) {
      __assert_fail("p->nTravIds < (1<<30)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                    ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
    }
    if (pNtk->vCos->nSize <= iCo) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    plVar3 = (long *)pNtk->vCos->pArray[(uint)iCo];
    vNodes = (Vec_Int_t *)malloc(0x10);
    vNodes->nCap = 100;
    vNodes->nSize = 0;
    piVar5 = (int *)malloc(400);
    vNodes->pArray = piVar5;
    Abc_NtkNodeSupportInt_rec
              (*(Abc_Obj_t **)
                (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8),vNodes);
    qsort(vNodes->pArray,(long)vNodes->nSize,4,Vec_IntSortCompare1);
  }
  return vNodes;
}

Assistant:

Vec_Int_t * Abc_NtkNodeSupportInt( Abc_Ntk_t * pNtk, int iCo )
{
    Vec_Int_t * vNodes;
    Abc_Obj_t * pObj; 
    int i;
    if ( iCo < 0 || iCo >= Abc_NtkCoNum(pNtk) )
        return NULL;
    // save node indices in the CI nodes
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = i;
    // collect the indexes of CI nodes in the TFI of the CO node
    Abc_NtkIncrementTravId( pNtk );
    pObj = Abc_NtkCo( pNtk, iCo );
    vNodes = Vec_IntAlloc( 100 );
    Abc_NtkNodeSupportInt_rec( Abc_ObjFanin0(pObj), vNodes );
    Vec_IntSort( vNodes, 0 );
    return vNodes;
}